

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.cpp
# Opt level: O0

Mat4x4 * phyr::_Mat4x4::inverse(Mat4x4 *mat)

{
  double dVar1;
  void *in_RSI;
  _Mat4x4 *in_RDI;
  int k;
  double anc;
  int j_1;
  int j;
  double coeff;
  int i;
  Mat4x4 m;
  int local_ac;
  int local_a0;
  int local_9c;
  int local_8c;
  double local_88 [17];
  
  memcpy(local_88,in_RSI,0x80);
  _Mat4x4(in_RDI);
  for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
    dVar1 = local_88[(long)local_8c * 4 + (long)local_8c];
    for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
      local_88[(long)local_8c * 4 + (long)local_9c] =
           (1.0 / dVar1) * local_88[(long)local_8c * 4 + (long)local_9c];
      in_RDI->d[local_8c][local_9c] = (1.0 / dVar1) * in_RDI->d[local_8c][local_9c];
    }
    for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
      if (local_a0 != local_8c) {
        dVar1 = local_88[(long)local_a0 * 4 + (long)local_8c];
        for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
          local_88[(long)local_a0 * 4 + (long)local_ac] =
               -dVar1 * local_88[(long)local_8c * 4 + (long)local_ac] +
               local_88[(long)local_a0 * 4 + (long)local_ac];
          in_RDI->d[local_a0][local_ac] =
               -dVar1 * in_RDI->d[local_8c][local_ac] + in_RDI->d[local_a0][local_ac];
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Mat4x4 Mat4x4::inverse(const Mat4x4& mat) {
    Mat4x4 m = mat, inv;

    // Reduce m to identity
    for (int i = 0; i < 4; i++) {
        ASSERT(!isZero(m.d[i][i]));
        // Anchor row is i
        Real coeff = 1.0 / m.d[i][i];
        // Normalize anchor row
        for (int j = 0; j < 4; j++) {
            m.d[i][j] *= coeff;
            // Repeat operation on inverse
            inv.d[i][j] *= coeff;
        }

        // Reduce other rows
        for (int j = 0; j < 4; j++) {
            // Skip anchor row
            if (j == i) continue;
            // For every other row,
            // Apply R[j] = R[j] - C[R[j], i] * R[i]
            Real anc = m.d[j][i];
            for (int k = 0; k < 4; k++) {
                m.d[j][k] -= anc * m.d[i][k];
                // Repeat operation on inverse
                inv.d[j][k] -= anc * inv.d[i][k];
            }
        }
    }

    return inv;
}